

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCasePackSnorm::test
          (ShaderBitfieldOperationCasePackSnorm *this,Data *data)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = floorf(data->inVec4[0] * 127.0 + 0.5);
  uVar1 = *(undefined8 *)(data->inVec4 + 1);
  fVar3 = floorf((float)uVar1 * 127.0 + 0.5);
  fVar4 = floorf((float)((ulong)uVar1 >> 0x20) * 127.0 + 0.5);
  fVar5 = floorf(data->inVec4[3] * 127.0 + 0.5);
  return ((int)fVar5 << 0x18 |
         (int)fVar4 * 0x10000 & 0xff0000U | ((int)fVar3 & 0xffU) << 8 | (int)fVar2 & 0xffU) ==
         data->outUvec4[0];
}

Assistant:

virtual bool test(Data const* data)
	{
		GLuint expected = ((int(deFloatFloor(data->inVec4[0] * 127.0f + 0.5f)) & 0xFF) << 0) |
						  ((int(deFloatFloor(data->inVec4[1] * 127.0f + 0.5f)) & 0xFF) << 8) |
						  ((int(deFloatFloor(data->inVec4[2] * 127.0f + 0.5f)) & 0xFF) << 16) |
						  ((int(deFloatFloor(data->inVec4[3] * 127.0f + 0.5f)) & 0xFF) << 24);
		if (expected != data->outUvec4[0])
		{
			return false;
		}
		return true;
	}